

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O0

int CfdInitializeCombinePubkey(void *handle,void **combine_handle)

{
  CfdException *this;
  void *pvVar1;
  void *__s;
  undefined8 *in_RSI;
  CfdException *except;
  exception *std_except;
  CfdCapiCombinePubkey *buffer;
  int result;
  string *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  CfdError error_code;
  allocator *paVar2;
  allocator local_99;
  string local_98 [38];
  undefined1 local_72;
  allocator local_71;
  string local_70 [32];
  CfdSourceLocation local_50;
  uint32_t size;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar3;
  
  error_code = (CfdError)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  uVar3 = 0xffffffff;
  size = 0;
  cfd::Initialize();
  if (in_RSI == (undefined8 *)0x0) {
    local_50.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_50.filename = local_50.filename + 1;
    local_50.line = 0x527;
    local_50.funcname = "CfdInitializeCombinePubkey";
    cfd::core::logger::warn<>(&local_50,"combine handle is null.");
    local_72 = 1;
    this = (CfdException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"Failed to parameter. combine handle is null.",&local_71);
    cfd::core::CfdException::CfdException(this,error_code,in_stack_ffffffffffffff30);
    local_72 = 0;
    __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  paVar2 = &local_99;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"CombinePubkey",paVar2);
  pvVar1 = cfd::capi::AllocBuffer((string *)CONCAT44(uVar3,in_stack_ffffffffffffffe0),size);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  __s = operator_new(0x18);
  memset(__s,0,0x18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x5d833c);
  *(void **)((long)pvVar1 + 0x10) = __s;
  *in_RSI = pvVar1;
  return 0;
}

Assistant:

int CfdInitializeCombinePubkey(void* handle, void** combine_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  CfdCapiCombinePubkey* buffer = nullptr;
  try {
    cfd::Initialize();
    if (combine_handle == nullptr) {
      warn(CFD_LOG_SOURCE, "combine handle is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. combine handle is null.");
    }

    buffer = static_cast<CfdCapiCombinePubkey*>(
        AllocBuffer(kPrefixCombinePubkey, sizeof(CfdCapiCombinePubkey)));
    buffer->pubkey_list = new std::vector<std::string>();
    *combine_handle = buffer;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  if (buffer != nullptr) CfdFreeCombinePubkeyHandle(handle, buffer);
  return result;
}